

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_1::oneWayComparePointSets
               (TestLog *log,Surface *errorDst,TessPrimitiveType primitiveType,
               vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *subset,
               vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *superset,
               char *subsetName,char *supersetName,RGBA *errorColor)

{
  ostringstream *this;
  pointer pVVar1;
  bool bVar2;
  __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
  _Var3;
  long lVar4;
  Vector<float,_3> *a;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  Vector<float,_3> *a_00;
  int local_218;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> supersetSorted;
  tcu local_1e3 [3];
  char *local_1e0;
  Surface *local_1d8;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *local_1d0;
  Vec3 matchMax;
  Vec3 matchMin;
  MessageBuilder local_1b0;
  
  local_1e0 = subsetName;
  local_1d8 = errorDst;
  local_1d0 = subset;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&supersetSorted,superset);
  std::
  __sort<__gnu_cxx::__normal_iterator<tcu::Vector<float,3>*,std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(tcu::Vector<float,3>const&,tcu::Vector<float,3>const&)>>
            ((__normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
              )supersetSorted.
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
              )supersetSorted.
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_tcu::Vector<float,_3>_&,_const_tcu::Vector<float,_3>_&)>
              )0x40a04a);
  lVar7 = 0;
  local_218 = 0;
  do {
    pVVar1 = (local_1d0->
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(local_1d0->
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0xc) <= lVar7) {
      std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
      ~_Vector_base(&supersetSorted.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   );
      return local_218 == 0;
    }
    a = pVVar1 + lVar7;
    tcu::operator-((tcu *)&matchMin,a,0.01);
    tcu::operator+((tcu *)&matchMax,0.01,a);
    local_1b0.m_log._0_4_ = matchMin.m_data[0];
    local_1b0.m_log._4_4_ = 0;
    local_1b0.m_str = (ostringstream)0x0;
    local_1b0._9_3_ = 0;
    _Var3 = std::
            __lower_bound<__gnu_cxx::__normal_iterator<tcu::Vector<float,3>const*,std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>,tcu::Vector<float,3>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(tcu::Vector<float,3>const&,tcu::Vector<float,3>const&)>>
                      ((__normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                        )supersetSorted.
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                        )supersetSorted.
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(Vector<float,_3> *)&local_1b0,
                       (_Iter_comp_val<bool_(*)(const_tcu::Vector<float,_3>_&,_const_tcu::Vector<float,_3>_&)>
                        )0x40a04a);
    if ((_Var3._M_current !=
         supersetSorted.
         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (uVar5 = (uint)(((long)_Var3._M_current -
                       (long)supersetSorted.
                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0xc), -1 < (int)uVar5)) {
      uVar6 = (ulong)(uVar5 & 0x7fffffff);
      for (lVar4 = uVar6 * 0xc;
          ((long)uVar6 <
           (long)(int)(((long)supersetSorted.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)supersetSorted.
                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0xc) &&
          (*(float *)((long)(supersetSorted.
                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar4) <=
           matchMax.m_data[0])); lVar4 = lVar4 + 0xc) {
        a_00 = (Vector<float,_3> *)
               ((long)(supersetSorted.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar4);
        tcu::greaterThanEqual<float,3>((tcu *)&local_1b0,a_00,&matchMin);
        bVar2 = tcu::boolAll<3>((Vector<bool,_3> *)&local_1b0);
        if (bVar2) {
          tcu::lessThanEqual<float,3>(local_1e3,a_00,&matchMax);
          bVar2 = tcu::boolAll<3>((Vector<bool,_3> *)local_1e3);
          if (bVar2) goto LAB_00409dfb;
        }
        uVar6 = uVar6 + 1;
      }
    }
    local_218 = local_218 + 1;
    this = &local_1b0.m_str;
    if (local_218 < 5) {
      local_1b0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::operator<<((ostream *)this,"Failure: no matching ");
      std::operator<<((ostream *)this,supersetName);
      std::operator<<((ostream *)this," point found for ");
      std::operator<<((ostream *)this,local_1e0);
      std::operator<<((ostream *)this," point ");
      tcu::operator<<((ostream *)this,a);
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00409dd9:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
    }
    else if (local_218 == 5) {
      local_1b0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
      std::operator<<((ostream *)&local_1b0.m_str,"Note: More errors follow");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00409dd9;
    }
    drawTessCoordPoint(local_1d8,primitiveType,a,errorColor,4);
LAB_00409dfb:
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static bool oneWayComparePointSets (TestLog&				log,
									tcu::Surface&			errorDst,
									TessPrimitiveType		primitiveType,
									const vector<Vec3>&		subset,
									const vector<Vec3>&		superset,
									const char*				subsetName,
									const char*				supersetName,
									const tcu::RGBA&		errorColor)
{
	const vector<Vec3>	supersetSorted			= sorted(superset, vec3XLessThan);
	const float			epsilon					= 0.01f;
	const int			maxNumFailurePrints		= 5;
	int					numFailuresDetected		= 0;

	for (int subNdx = 0; subNdx < (int)subset.size(); subNdx++)
	{
		const Vec3& subPt = subset[subNdx];

		bool matchFound = false;

		{
			// Binary search the index of the first point in supersetSorted with x in the [subPt.x() - epsilon, subPt.x() + epsilon] range.
			const Vec3	matchMin			= subPt - epsilon;
			const Vec3	matchMax			= subPt + epsilon;
			int			firstCandidateNdx	= binarySearchFirstVec3WithXAtLeast(supersetSorted, matchMin.x());

			if (firstCandidateNdx >= 0)
			{
				// Compare subPt to all points in supersetSorted with x in the [subPt.x() - epsilon, subPt.x() + epsilon] range.
				for (int superNdx = firstCandidateNdx; superNdx < (int)supersetSorted.size() && supersetSorted[superNdx].x() <= matchMax.x(); superNdx++)
				{
					const Vec3& superPt = supersetSorted[superNdx];

					if (tcu::boolAll(tcu::greaterThanEqual	(superPt, matchMin)) &&
						tcu::boolAll(tcu::lessThanEqual		(superPt, matchMax)))
					{
						matchFound = true;
						break;
					}
				}
			}
		}

		if (!matchFound)
		{
			numFailuresDetected++;
			if (numFailuresDetected < maxNumFailurePrints)
				log << TestLog::Message << "Failure: no matching " << supersetName << " point found for " << subsetName << " point " << subPt << TestLog::EndMessage;
			else if (numFailuresDetected == maxNumFailurePrints)
				log << TestLog::Message << "Note: More errors follow" << TestLog::EndMessage;

			drawTessCoordPoint(errorDst, primitiveType, subPt, errorColor, 4);
		}
	}

	return numFailuresDetected == 0;
}